

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QTreeWidgetItem_*>::begin(QList<QTreeWidgetItem_*> *this)

{
  QTreeWidgetItem **n;
  QArrayDataPointer<QTreeWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTreeWidgetItem_*> *)0x91c279);
  QArrayDataPointer<QTreeWidgetItem_*>::operator->(in_RDI);
  n = QArrayDataPointer<QTreeWidgetItem_*>::begin((QArrayDataPointer<QTreeWidgetItem_*> *)0x91c28a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }